

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O1

int test_ipcmsg_testresults(ITesting *t)

{
  bool bVar1;
  kTRContinueMode kVar2;
  int iVar3;
  UTest_IPC_VectorWriter vectorWriter;
  Ref tr;
  IPCBufferedWriter bufferedWriter;
  IPCTestResults testResultsOut;
  IPCTestResults testResultsIn;
  IPCBinaryEncoder encoder;
  IPCBinaryDecoder decoder;
  UTest_IPC_VectorReader vectorReader;
  IPCWriter local_188;
  void *local_180;
  void *pvStack_178;
  long local_170;
  undefined1 local_168 [32];
  _Alloc_hider local_148;
  undefined1 local_138 [8];
  undefined1 local_130 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined **local_f0;
  pointer local_e8;
  pointer pAStack_e0;
  pointer local_d8;
  IPCTestResults local_d0;
  IPCEncoderBase local_70;
  IPCBufferedWriter *local_68;
  IPCBinaryDecoder local_60;
  IPCReader local_48;
  undefined8 local_40;
  void **local_38;
  
  local_130._0_8_ = &local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"test_module_case","");
  trun::TestResult::Create((TestResult *)local_168,(string *)local_130);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130._0_8_ !=
      &local_120) {
    operator_delete((void *)local_130._0_8_,(ulong)(local_120._M_dataplus._M_p + 1));
  }
  *(undefined1 *)(local_168._0_8_ + 0x41) = 0;
  local_130._0_8_ = &PTR__IPCTestResults_00227090;
  local_130._8_8_ = &PTR__IPCTestResults_002270c8;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_100._M_allocated_capacity = local_168._0_8_;
  local_100._8_8_ = local_168._8_8_;
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((string *)(local_168._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_168._8_8_ + 8))->_M_dataplus)._M_p + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((string *)(local_168._8_8_ + 8))->_M_dataplus)._M_p =
           *(int *)&(((string *)(local_168._8_8_ + 8))->_M_dataplus)._M_p + 1;
    }
  }
  local_f0 = &PTR__AssertError_00226700;
  local_e8 = (pointer)0x0;
  pAStack_e0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_120,0,0,"test_module_case",0x10);
  local_188._vptr_IPCWriter = (_func_int **)&PTR_Write_002268f8;
  local_180 = (void *)0x0;
  pvStack_178 = (void *)0x0;
  local_170 = 0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter((IPCBufferedWriter *)(local_168 + 0x10),&local_188);
  local_70.super_IPCWriter._vptr_IPCWriter = (IPCWriter)&PTR_Write_00226f18;
  local_68 = (IPCBufferedWriter *)(local_168 + 0x10);
  bVar1 = gnilk::IPCTestResults::Marshal((IPCTestResults *)local_130,&local_70);
  if (!bVar1) {
    kVar2 = (*t->AssertError)(0x48,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"testResultsOut.Marshal(encoder)");
    if (kVar2 != kTRLeave) goto LAB_00166f07;
LAB_0016701e:
    iVar3 = 0x10;
    goto LAB_00167037;
  }
LAB_00166f07:
  gnilk::IPCBufferedWriter::Flush((IPCBufferedWriter *)(local_168 + 0x10));
  if (local_180 == pvStack_178) {
    kVar2 = (*t->AssertError)(0x4b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"!vectorWriter.Data().empty()");
    if (kVar2 == kTRLeave) goto LAB_0016701e;
  }
  local_38 = &local_180;
  local_60.reader = &local_48;
  local_48._vptr_IPCReader = (_func_int **)&PTR_Read_00226948;
  local_40 = 0;
  local_60.deserializer = &local_d0.super_IPCDeserializer;
  local_d0.super_IPCSerializer._vptr_IPCSerializer = (_func_int **)&PTR__IPCTestResults_00227090;
  local_d0.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCTestResults_002270c8;
  local_d0.symbolName._M_dataplus._M_p = (pointer)&local_d0.symbolName.field_2;
  local_d0.symbolName._M_string_length = 0;
  local_d0.symbolName.field_2._M_local_buf[0] = '\0';
  local_d0.testResult.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_d0.testResult.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d0.assertError._vptr_AssertError = (_func_int **)&PTR__AssertError_00226700;
  local_d0.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.assertError.assertErrors.
  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_00226e48;
  bVar1 = gnilk::IPCBinaryDecoder::Process(&local_60);
  if (bVar1) {
LAB_00166fd6:
    if (local_d0.symbolName._M_string_length == local_120._M_string_length) {
      if (local_d0.symbolName._M_string_length != 0) {
        iVar3 = bcmp(local_d0.symbolName._M_dataplus._M_p,local_120._M_dataplus._M_p,
                     local_d0.symbolName._M_string_length);
        if (iVar3 != 0) goto LAB_00167000;
      }
    }
    else {
LAB_00167000:
      kVar2 = (*t->AssertError)(0x54,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"testResultsIn.symbolName == testResultsOut.symbolName");
      if (kVar2 == kTRLeave) goto LAB_00167025;
    }
    iVar3 = 0;
  }
  else {
    kVar2 = (*t->AssertError)(0x52,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"decoder.Process()");
    if (kVar2 != kTRLeave) goto LAB_00166fd6;
LAB_00167025:
    iVar3 = 0x10;
  }
  gnilk::IPCTestResults::~IPCTestResults(&local_d0);
LAB_00167037:
  local_168._16_8_ = &PTR_Write_00226e08;
  if (local_148._M_p != (pointer)0x0) {
    operator_delete(local_148._M_p,(long)local_138 - (long)local_148._M_p);
  }
  local_188._vptr_IPCWriter = (_func_int **)&PTR_Write_002268f8;
  if (local_180 != (void *)0x0) {
    operator_delete(local_180,local_170 - (long)local_180);
  }
  gnilk::IPCTestResults::~IPCTestResults((IPCTestResults *)local_130);
  if ((pointer)local_168._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
  }
  return iVar3;
}

Assistant:

DLL_EXPORT int test_ipcmsg_testresults(ITesting *t) {

    auto tr = trun::TestResult::Create("test_module_case");
    tr->SetResult(trun::kTestResult::kTestResult_Pass);

    gnilk::IPCTestResults testResultsOut(tr);
    testResultsOut.symbolName = "test_module_case";

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, testResultsOut.Marshal(encoder));

    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCTestResults testResultsIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, testResultsIn);

    TR_ASSERT(t, decoder.Process());

    TR_ASSERT(t, testResultsIn.symbolName == testResultsOut.symbolName);

    return kTR_Pass;
}